

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O2

bool Kernel::MatchingUtils::match<Inferences::FastCondensation::CondensationBinder>
               (Literal *base,Literal *instance,bool complementary,CondensationBinder *binder)

{
  bool bVar1;
  CondensationBinder *binder_00;
  bool bVar2;
  
  binder_00 = binder;
  bVar1 = Literal::headersMatch(base,instance,complementary);
  if (bVar1) {
    if ((*(uint *)&(base->super_Term).field_0xc & 0xfffffff) == 0) {
      bVar1 = true;
    }
    else {
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                (&binder->bindings);
      bVar2 = (base->super_Term)._functor == 0;
      bVar1 = matchArgs<Inferences::FastCondensation::CondensationBinder>
                        ((MatchingUtils *)base,&instance->super_Term,(Term *)binder,binder_00);
      if (bVar2 && !bVar1) {
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                  (&binder->bindings);
        bVar1 = matchReversedArgs<Inferences::FastCondensation::CondensationBinder>
                          ((MatchingUtils *)base,instance,(Literal *)binder,binder_00);
        return bVar1;
      }
      bVar1 = bVar1 || bVar2;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool match(Literal* base, Literal* instance, bool complementary, Binder& binder)
  {
    if(!Literal::headersMatch(base,instance,complementary)) {
      return false;
    }

    if(base->arity()==0) {
      return true;
    }

    binder.reset();

    if(base->isEquality()) {
      ASS_EQ(base->arity(), 2);
      if(matchArgs(base, instance, binder)) {
        return true;
      }
      binder.reset();
      return matchReversedArgs(base, instance, binder);
    } else {
      return matchArgs(base, instance, binder);
    }
  }